

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

shared_ptr<mcc::ControlFlow> __thiscall mcc::Parser::BreakStatement(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TokenType in_ESI;
  shared_ptr<mcc::ControlFlow> sVar1;
  allocator<char> local_59;
  string local_58 [32];
  shared_ptr<mcc::Token> local_38;
  undefined1 local_28 [8];
  shared_ptr<mcc::Token> token;
  Parser *this_local;
  
  Consume((Parser *)local_28,in_ESI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"Expected \';\' after \'break\' statement",&local_59);
  Consume((Parser *)&local_38,in_ESI,(string *)0x6);
  std::shared_ptr<mcc::Token>::~shared_ptr(&local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::make_shared<mcc::ControlFlow,std::shared_ptr<mcc::Token>&,bool>
            ((shared_ptr<mcc::Token> *)this,(bool *)local_28);
  std::shared_ptr<mcc::Token>::~shared_ptr((shared_ptr<mcc::Token> *)local_28);
  sVar1.super___shared_ptr<mcc::ControlFlow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mcc::ControlFlow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mcc::ControlFlow>)
         sVar1.super___shared_ptr<mcc::ControlFlow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ControlFlow> Parser::BreakStatement() {
  std::shared_ptr<Token> token = Consume(TokenType::T_BREAK);
  Consume(TokenType::T_SEMICOLON, "Expected ';' after 'break' statement");
  return std::make_shared<ControlFlow>(token, true);
}